

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O2

int AppendToZip(FILE *zip_file,char *filename,FCompressedBuffer *content,uint16_t date,uint16_t time
               )

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  undefined4 local_50;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  uint16_t local_46;
  uint16_t local_44;
  uint local_42;
  undefined8 local_3e;
  undefined2 local_36;
  undefined2 local_34;
  
  local_50 = 0x4034b50;
  local_4c = 0x14;
  local_4a = 2;
  if (content->mMethod != 8) {
    local_4a = (undefined2)content->mZipFlags;
  }
  local_48 = (undefined2)content->mMethod;
  local_42 = content->mCRC32;
  uVar1 = content->mSize;
  uVar2 = content->mCompressedSize;
  local_3e = CONCAT44(uVar1,uVar2);
  local_46 = time;
  local_44 = date;
  sVar3 = strlen(filename);
  local_36 = (undefined2)sVar3;
  local_34 = 0;
  lVar4 = ftell((FILE *)zip_file);
  sVar3 = fwrite(&local_50,0x1e,1,(FILE *)zip_file);
  iVar5 = -1;
  if (sVar3 == 1) {
    sVar3 = strlen(filename);
    sVar3 = fwrite(filename,sVar3,1,(FILE *)zip_file);
    if (sVar3 == 1) {
      sVar3 = fwrite(content->mBuffer,1,(ulong)content->mCompressedSize,(FILE *)zip_file);
      iVar5 = -1;
      if (sVar3 == content->mCompressedSize) {
        iVar5 = (int)lVar4;
      }
    }
  }
  return iVar5;
}

Assistant:

int AppendToZip(FILE *zip_file, const char *filename, FCompressedBuffer &content, uint16_t date, uint16_t time)
{
	FZipLocalFileHeader local;
	int position;

	local.Magic = ZIP_LOCALFILE;
	local.VersionToExtract[0] = 20;
	local.VersionToExtract[1] = 0;
	local.Flags = content.mMethod == METHOD_DEFLATE ? LittleShort(2) : LittleShort((uint16_t)content.mZipFlags);
	local.Method = LittleShort(content.mMethod);
	local.ModDate = date;
	local.ModTime = time;
	local.CRC32 = content.mCRC32;
	local.UncompressedSize = LittleLong(content.mSize);
	local.CompressedSize = LittleLong(content.mCompressedSize);
	local.NameLength = LittleShort((unsigned short)strlen(filename));
	local.ExtraLength = 0;

	// Fill in local directory header.

	position = (int)ftell(zip_file);

	// Write out the header, file name, and file data.
	if (fwrite(&local, sizeof(local), 1, zip_file) != 1 ||
		fwrite(filename, strlen(filename), 1, zip_file) != 1 ||
		fwrite(content.mBuffer, 1, content.mCompressedSize, zip_file) != content.mCompressedSize)
	{
		return -1;
	}
	return position;
}